

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O3

pair<pstore::uint128,_pstore::extent<pstore::repo::compilation>_> * __thiscall
pstore::serialize::
read<std::pair<pstore::uint128,pstore::extent<pstore::repo::compilation>>,pstore::serialize::archive::database_reader>
          (pair<pstore::uint128,_pstore::extent<pstore::repo::compilation>_> *__return_storage_ptr__
          ,serialize *this,database_reader *archive)

{
  span<unsigned_char,__1L> sp;
  extent_type<_1L> unaff_R15;
  type uninit_buffer;
  uint128 local_38;
  value_type local_28;
  
  sp.storage_.data_ = (pointer)uninit_buffer._._0_8_;
  sp.storage_.super_extent_type<_1L>.size_ = unaff_R15.size_;
  flood<_1l>(sp);
  serialize::archive::database_reader::get<pstore::uint128,void>((database_reader *)this,&local_38);
  serializer<pstore::extent<pstore::repo::compilation>,void>::
  read<pstore::serialize::archive::database_reader&>((database_reader *)this,&local_28);
  (__return_storage_ptr__->second).addr.a_.a_ = (value_type)local_28.addr.a_.a_;
  (__return_storage_ptr__->second).size = local_28.size;
  *(undefined8 *)&(__return_storage_ptr__->first).v_ = (undefined8)local_38.v_;
  *(undefined8 *)((long)&(__return_storage_ptr__->first).v_ + 8) = local_38.v_._8_8_;
  return __return_storage_ptr__;
}

Assistant:

Ty read (Archive && archive) {
            using T2 = typename std::remove_const<Ty>::type;
            typename details::aligned_storage<sizeof (T2), alignof (T2)>::type uninit_buffer;
            flood (&uninit_buffer);

            // Deserialize into the uninitialized buffer.
            auto & t2 = reinterpret_cast<T2 &> (uninit_buffer);
            read_uninit (std::forward<Archive> (archive), t2);

            // This object will destroy the remains of the T2 instance in uninit_buffer.
            auto dtor = [] (T2 * p) { p->~T2 (); };
            std::unique_ptr<T2, decltype (dtor)> d (&t2, dtor);
            return std::move (t2);
        }